

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

void uiter_setState_63(UCharIterator *iter,uint32_t state,UErrorCode *pErrorCode)

{
  if ((pErrorCode == (UErrorCode *)0x0) || (U_ZERO_ERROR < *pErrorCode)) {
    return;
  }
  if (iter == (UCharIterator *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  if (iter->setState != (UCharIteratorSetState *)0x0) {
    (*iter->setState)(iter,state,pErrorCode);
    return;
  }
  *pErrorCode = U_UNSUPPORTED_ERROR;
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setState(UCharIterator *iter, uint32_t state, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        /* do nothing */
    } else if(iter==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    } else if(iter->setState==NULL) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
    } else {
        iter->setState(iter, state, pErrorCode);
    }
}